

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapOrSetDataList.h
# Opt level: O2

void __thiscall
Js::MapOrSetDataList<void_*>::Remove(MapOrSetDataList<void_*> *this,MapOrSetDataNode<void_*> *node)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type *this_00;
  WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_> local_30;
  Type next;
  Type prev;
  
  Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>::WriteBarrierPtr(&local_30,&node->next);
  Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>::WriteBarrierPtr(&next,&node->prev);
  if (local_30.ptr == (MapOrSetDataNode<void_*> *)0x0) {
    if ((this->last).ptr != node) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/MapOrSetDataList.h"
                                  ,0xb2,"(last == node)","last == node");
      if (!bVar2) goto LAB_00bb97d2;
      *puVar3 = 0;
    }
    this_00 = &this->last;
  }
  else {
    this_00 = &(local_30.ptr)->prev;
  }
  Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>::WriteBarrierSet(this_00,next.ptr);
  if ((next.ptr == (MapOrSetDataNode<void_*> *)0x0) &&
     (next.ptr = (MapOrSetDataNode<void_*> *)this, (this->first).ptr != node)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/MapOrSetDataList.h"
                                ,0xbc,"(first == node)","first == node");
    if (!bVar2) {
LAB_00bb97d2:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>::WriteBarrierSet
            (&(next.ptr)->next,local_30.ptr);
  return;
}

Assistant:

void Remove(MapOrSetDataNode<TData>* node)
        {
            // Cannot delete the node itself, nor change its next and prev pointers!
            // Otherwise active iterators may break. Iterators depend on nodes existing
            // until garbage collector picks them up.
            auto next = node->next;
            auto prev = node->prev;

            if (next)
            {
                next->prev = prev;
            }
            else
            {
                Assert(last == node);
                last = prev;
            }

            if (prev)
            {
                prev->next = next;
            }
            else
            {
                Assert(first == node);
                first = next;
            }
        }